

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjCmp(jx9_value *pObj1,jx9_value *pObj2,int bStrict,int iNest)

{
  double dVar1;
  jx9_hashmap *pjVar2;
  jx9_hashmap *pMap;
  uint uVar3;
  sxi32 sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  jx9_hashmap_node *pLeft;
  bool bVar8;
  jx9_hashmap_node *local_38;
  
  uVar7 = pObj1->iFlags;
  uVar3 = pObj2->iFlags;
  if ((bStrict != 0) && (uVar3 = uVar7, uVar7 != pObj2->iFlags)) {
    return 1;
  }
  uVar6 = uVar3 | uVar7;
  if ((uVar6 & 0x108) != 0) {
    if ((uVar7 & 8) == 0) {
      jx9MemObjToBool(pObj1);
      uVar3 = pObj2->iFlags;
    }
    if ((uVar3 & 8) == 0) {
      jx9MemObjToBool(pObj2);
    }
    return (((pObj1->x).iVal != 0) - 1) + (uint)((pObj2->x).iVal == 0);
  }
  if ((uVar6 & 0x20) == 0) {
    if ((uVar6 & 0x40) != 0) {
      if ((uVar7 & 0x40) == 0) {
        return -1;
      }
      if ((uVar3 & 0x40) == 0) {
        return 1;
      }
      pjVar2 = (jx9_hashmap *)(pObj1->x).iVal;
      pMap = (jx9_hashmap *)(pObj2->x).pOther;
      if (pjVar2 == pMap) {
        return 0;
      }
      uVar7 = pjVar2->nEntry;
      if (uVar7 == pMap->nEntry) {
        pLeft = pjVar2->pFirst;
        local_38 = (jx9_hashmap_node *)0x0;
        while( true ) {
          bVar8 = uVar7 == 0;
          uVar7 = uVar7 - 1;
          if (bVar8) {
            return 0;
          }
          if (pLeft->iType == 1) {
            iVar5 = HashmapLookupIntKey(pMap,(pLeft->xKey).iKey,&local_38);
          }
          else {
            iVar5 = HashmapLookupBlobKey
                              (pMap,(pLeft->xKey).sKey.pBlob,(pLeft->xKey).sKey.nByte,&local_38);
          }
          if ((iVar5 != 0) || ((bStrict != 0 && (pLeft->iType != local_38->iType)))) break;
          sVar4 = HashmapNodeCmp(pLeft,local_38,bStrict);
          if (sVar4 != 0) {
            return sVar4;
          }
          pLeft = pLeft->pPrev;
        }
        return 1;
      }
      return (pMap->nEntry < uVar7) - 1 | 1;
    }
    if ((uVar6 & 1) != 0) {
      if ((uVar7 & 1) == 0) {
        jx9MemObjToString(pObj1);
        uVar3 = pObj2->iFlags;
      }
      if ((uVar3 & 1) == 0) {
        jx9MemObjToString(pObj2);
      }
      uVar7 = (pObj1->sBlob).nByte;
      uVar3 = (pObj2->sBlob).nByte;
      uVar6 = uVar3;
      if (uVar7 < uVar3) {
        uVar6 = uVar7;
      }
      sVar4 = SyMemcmp((pObj1->sBlob).pBlob,(pObj2->sBlob).pBlob,uVar6);
      if (sVar4 == 0) {
        if (uVar7 == uVar3) {
          return 0;
        }
        return -(uint)(uVar7 < uVar3) | 1;
      }
      return sVar4;
    }
    if ((uVar6 & 6) != 0) {
      if ((uVar7 & 6) == 0) {
        jx9MemObjToNumeric(pObj1);
        uVar3 = pObj2->iFlags;
      }
      if ((uVar3 & 6) == 0) {
        jx9MemObjToNumeric(pObj2);
        uVar3 = pObj2->iFlags;
      }
      if ((pObj1->iFlags & uVar3 & 2) == 0) {
        if ((pObj1->iFlags & 4U) == 0) {
          jx9MemObjToReal(pObj1);
          uVar3 = pObj2->iFlags;
        }
        dVar1 = (pObj1->x).rVal;
        if ((uVar3 & 4) == 0) {
          jx9MemObjToReal(pObj2);
        }
        if (dVar1 <= (pObj2->x).rVal) {
          return -(uint)(dVar1 < (pObj2->x).rVal);
        }
        return 1;
      }
      if ((pObj1->x).iVal <= (pObj2->x).iVal) {
        return -(uint)((pObj1->x).iVal < (pObj2->x).iVal);
      }
      return 1;
    }
  }
  else {
    if ((uVar7 & 0x20) == 0) {
      return 1;
    }
    if ((uVar3 & 0x20) == 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjCmp(jx9_value *pObj1, jx9_value *pObj2, int bStrict, int iNest)
{
	sxi32 iComb; 
	sxi32 rc;
	if( bStrict ){
		sxi32 iF1, iF2;
		/* Strict comparisons with === */
		iF1 = pObj1->iFlags;
		iF2 = pObj2->iFlags;
		if( iF1 != iF2 ){
			/* Not of the same type */
			return 1;
		}
	}
	/* Combine flag together */
	iComb = pObj1->iFlags|pObj2->iFlags;
	if( iComb & (MEMOBJ_RES|MEMOBJ_BOOL) ){
		/* Convert to boolean: Keep in mind FALSE < TRUE */
		if( (pObj1->iFlags & MEMOBJ_BOOL) == 0 ){
			jx9MemObjToBool(pObj1);
		}
		if( (pObj2->iFlags & MEMOBJ_BOOL) == 0 ){
			jx9MemObjToBool(pObj2);
		}
		return (sxi32)((pObj1->x.iVal != 0) - (pObj2->x.iVal != 0));
	}else if( iComb & MEMOBJ_NULL ){
		if( (pObj1->iFlags & MEMOBJ_NULL) == 0 ){
			return 1;
		}
		if( (pObj2->iFlags & MEMOBJ_NULL) == 0 ){
			return -1;
		}
	}else if ( iComb & MEMOBJ_HASHMAP ){
		/* Hashmap aka 'array' comparison */
		if( (pObj1->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* Array is always greater */
			return -1;
		}
		if( (pObj2->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* Array is always greater */
			return 1;
		}
		/* Perform the comparison */
		rc = jx9HashmapCmp((jx9_hashmap *)pObj1->x.pOther, (jx9_hashmap *)pObj2->x.pOther, bStrict);
		return rc;
	}else if ( iComb & MEMOBJ_STRING ){
		SyString s1, s2;
		/* Perform a strict string comparison.*/
		if( (pObj1->iFlags&MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(pObj1);
		}
		if( (pObj2->iFlags&MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(pObj2);
		}
		SyStringInitFromBuf(&s1, SyBlobData(&pObj1->sBlob), SyBlobLength(&pObj1->sBlob));
		SyStringInitFromBuf(&s2, SyBlobData(&pObj2->sBlob), SyBlobLength(&pObj2->sBlob));
		/*
		 * Strings are compared using memcmp(). If one value is an exact prefix of the
		 * other, then the shorter value is less than the longer value.
		 */
		rc = SyMemcmp((const void *)s1.zString, (const void *)s2.zString, SXMIN(s1.nByte, s2.nByte));
		if( rc == 0 ){
			if( s1.nByte != s2.nByte ){
				rc = s1.nByte < s2.nByte ? -1 : 1;
			}
		}
		return rc;
	}else if( iComb & (MEMOBJ_INT|MEMOBJ_REAL) ){
		/* Perform a numeric comparison if one of the operand is numeric(integer or real) */
		if( (pObj1->iFlags & (MEMOBJ_INT|MEMOBJ_REAL)) == 0 ){
			jx9MemObjToNumeric(pObj1);
		}
		if( (pObj2->iFlags & (MEMOBJ_INT|MEMOBJ_REAL)) == 0 ){
			jx9MemObjToNumeric(pObj2);
		}
		if( (pObj1->iFlags & pObj2->iFlags & MEMOBJ_INT) == 0) {
			jx9_real r1, r2;
			/* Compare as reals */
			if( (pObj1->iFlags & MEMOBJ_REAL) == 0 ){
				jx9MemObjToReal(pObj1);
			}
			r1 = pObj1->x.rVal;	
			if( (pObj2->iFlags & MEMOBJ_REAL) == 0 ){
				jx9MemObjToReal(pObj2);
			}
			r2 = pObj2->x.rVal;
			if( r1 > r2 ){
				return 1;
			}else if( r1 < r2 ){
				return -1;
			}
			return 0;
		}else{
			/* Integer comparison */
			if( pObj1->x.iVal > pObj2->x.iVal ){
				return 1;
			}else if( pObj1->x.iVal < pObj2->x.iVal ){
				return -1;
			}
			return 0;
		}
	}
	/* NOT REACHED */
	SXUNUSED(iNest);
	return 0;
}